

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectCommand.cpp
# Opt level: O1

void __thiscall ConnectCommand::ConnectCommand(ConnectCommand *this)

{
  int iVar1;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_execute_00116d60;
  (this->host_address)._M_dataplus._M_p = (pointer)&(this->host_address).field_2;
  (this->host_address)._M_string_length = 0;
  (this->host_address).field_2._M_local_buf[0] = '\0';
  iVar1 = socket(2,1,0);
  this->client_socket = iVar1;
  if (iVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"could not create a socket",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  return;
}

Assistant:

ConnectCommand::ConnectCommand() {
  this->client_socket = socket(AF_INET, SOCK_STREAM, 0);
  if (client_socket == -1) {
    cerr << "could not create a socket" << endl;
  }
}